

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O0

bool __thiscall
google::protobuf::io::CodedInputStream::ReadVarint64Slow(CodedInputStream *this,uint64 *value)

{
  byte bVar1;
  bool bVar2;
  ulong *in_RSI;
  CodedInputStream *in_RDI;
  uint32 b;
  int count;
  uint64 result;
  CodedInputStream *in_stack_00000098;
  int local_24;
  ulong local_20;
  
  local_20 = 0;
  local_24 = 0;
  do {
    if (local_24 == 10) {
      *in_RSI = 0;
      return false;
    }
    while (in_RDI->buffer_ == in_RDI->buffer_end_) {
      bVar2 = Refresh(in_stack_00000098);
      if (!bVar2) {
        *in_RSI = 0;
        return false;
      }
    }
    bVar1 = *in_RDI->buffer_;
    local_20 = (ulong)(bVar1 & 0x7f) << ((char)local_24 * '\a' & 0x3fU) | local_20;
    Advance(in_RDI,1);
    local_24 = local_24 + 1;
  } while ((bVar1 & 0x80) != 0);
  *in_RSI = local_20;
  return true;
}

Assistant:

bool CodedInputStream::ReadVarint64Slow(uint64* value) {
  // Slow path:  This read might cross the end of the buffer, so we
  // need to check and refresh the buffer if and when it does.

  uint64 result = 0;
  int count = 0;
  uint32 b;

  do {
    if (count == kMaxVarintBytes) {
      *value = 0;
      return false;
    }
    while (buffer_ == buffer_end_) {
      if (!Refresh()) {
        *value = 0;
        return false;
      }
    }
    b = *buffer_;
    result |= static_cast<uint64>(b & 0x7F) << (7 * count);
    Advance(1);
    ++count;
  } while (b & 0x80);

  *value = result;
  return true;
}